

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O0

void __thiscall
CombinedH264Demuxer::CombinedH264Demuxer
          (CombinedH264Demuxer *this,BufferedReaderManager *readManager,char *streamName)

{
  int iVar1;
  AbstractReader *pAVar2;
  VodCoreException *this_00;
  string local_1c8;
  ostringstream local_1a8 [8];
  ostringstream ss;
  char *streamName_local;
  BufferedReaderManager *readManager_local;
  CombinedH264Demuxer *this_local;
  
  AbstractDemuxer::AbstractDemuxer(&this->super_AbstractDemuxer);
  CombinedH264Reader::CombinedH264Reader(&this->super_CombinedH264Reader);
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer =
       (_func_int **)&PTR__CombinedH264Demuxer_004405f0;
  (this->super_CombinedH264Reader)._vptr_CombinedH264Reader =
       (_func_int **)&PTR__CombinedH264Demuxer_00440690;
  this->m_readManager = readManager;
  pAVar2 = BufferedReaderManager::getReader(this->m_readManager,streamName);
  this->m_bufferedReader = pAVar2;
  iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[6])(this->m_bufferedReader,0x80);
  this->m_readerID = iVar1;
  if (this->m_bufferedReader == (AbstractReader *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "TS demuxer can\'t accept reader because this reader does not support BufferedReader interface"
                   );
    this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(this_00,3,&local_1c8);
    __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->m_lastReadRez = 0;
  this->m_dataProcessed = 0;
  return;
}

Assistant:

CombinedH264Demuxer::CombinedH264Demuxer(const BufferedReaderManager& readManager, const char* streamName)
    : m_readManager(readManager)
{
    m_bufferedReader = m_readManager.getReader(streamName);
    m_readerID = m_bufferedReader->createReader(MAX_TMP_BUFFER_SIZE);
    if (m_bufferedReader == nullptr)
        THROW(ERR_COMMON,
              "TS demuxer can't accept reader because this reader does not support BufferedReader interface")
    m_lastReadRez = 0;
    m_dataProcessed = 0;
}